

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O1

btree_result btree_insert(btree *btree,void *key,void *value)

{
  ushort uVar1;
  btree_print_func *pbVar2;
  _func_voidref_void_ptr_bid_t *p_Var3;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var4;
  _func_bid_t_void_ptr *p_Var5;
  void *pvVar6;
  code *pcVar7;
  _func_voidref_bid_t_ptr *p_Var8;
  void *pvVar9;
  bid_t bVar10;
  list_elem *plVar11;
  _func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *p_Var12;
  _func_size_t_void_ptr_bid_t *p_Var13;
  _func_int_void_ptr_bid_t *p_Var14;
  _func_void_void_ptr_bid_t *p_Var15;
  _func_voidref_void_ptr_bid_t_bid_t_ptr *p_Var16;
  _func_void_void_ptr *p_Var17;
  list_elem *plVar18;
  size_t sVar19;
  idx_t *idx;
  bnode **node_00;
  idx_t iVar20;
  int iVar21;
  undefined8 *puVar22;
  void *pvVar23;
  bnode *pbVar24;
  bnode *pbVar25;
  bid_t bVar26;
  voidref pvVar27;
  size_t sVar28;
  ulong uVar29;
  list_elem *plVar30;
  ulong uVar31;
  bnode **ppbVar32;
  ulong __n;
  list_elem *plVar33;
  undefined1 *__s;
  byte bVar34;
  uint uVar35;
  bnode *node;
  void *pvVar36;
  undefined1 *__s_00;
  long lVar37;
  bid_t *pbVar38;
  list *plVar39;
  bool bVar40;
  bnode *apbStack_120 [9];
  list lStack_d8;
  bid_t _bid;
  bid_t new_bid;
  ulong local_b8;
  size_t local_b0;
  size_t nodesize;
  void *local_a0;
  ulong local_98;
  undefined1 *local_90;
  uint local_88;
  int local_84;
  void *local_80;
  idx_t *local_78;
  void *local_70;
  void *local_68;
  list *local_60;
  list *local_58;
  bnode **local_50;
  void *local_48;
  bid_t *local_40;
  char local_32;
  bool local_31;
  
  local_48 = (void *)((long)&lStack_d8 - (ulong)(btree->ksize + 0xf & 0xfffffff0));
  local_80 = (void *)((long)local_48 - (ulong)(btree->vsize + 0xf & 0xfffffff0));
  uVar1 = btree->height;
  __n = (ulong)uVar1;
  local_78 = (idx_t *)((long)local_80 - (ulong)((uint)uVar1 * 2 + 0xf & 0xfffffff0));
  uVar29 = (ulong)((uint)uVar1 * 8 + 0xf & 0xfffffff0);
  local_40 = (bid_t *)((long)local_78 - uVar29);
  uVar31 = (ulong)(uVar1 + 0xf & 0xfffffff0);
  local_70 = (void *)((long)local_40 - uVar31);
  pvVar36 = (void *)((long)local_70 - uVar31);
  __s_00 = (undefined1 *)((long)pvVar36 - uVar31);
  __s = __s_00 + -uVar31;
  local_58 = (list *)(__s + (ulong)uVar1 * -0x10);
  ppbVar32 = (bnode **)((long)local_58 - uVar29);
  local_68 = key;
  local_60 = (list *)value;
  local_50 = ppbVar32;
  if (uVar1 != 0) {
    ppbVar32[-1] = (bnode *)0x10c839;
    memset(__s,0,__n);
    ppbVar32[-1] = (bnode *)0x10c846;
    memset(__s_00,0,__n);
    pvVar23 = local_70;
    ppbVar32[-1] = (bnode *)0x10c854;
    memset(pvVar23,0,__n);
    ppbVar32[-1] = (bnode *)0x10c861;
    memset(pvVar36,0,__n);
  }
  pvVar9 = local_48;
  pvVar23 = local_80;
  pbVar2 = btree->kv_ops->init_kv_var;
  nodesize = (size_t)__s;
  local_a0 = pvVar36;
  local_90 = __s_00;
  if (pbVar2 != (btree_print_func *)0x0) {
    ppbVar32[-1] = (bnode *)0x10c890;
    (*pbVar2)(btree,pvVar9,pvVar23);
    plVar39 = local_58;
    uVar1 = btree->height;
    if (uVar1 != 0) {
      ppbVar32[-1] = (bnode *)0x10c8a7;
      memset(plVar39,0,(ulong)uVar1 << 4);
    }
  }
  ppbVar32[-1] = (bnode *)0x10c8b1;
  puVar22 = (undefined8 *)malloc(0x20);
  bVar34 = btree->ksize;
  ppbVar32[-1] = (bnode *)0x10c8bc;
  pvVar36 = malloc((ulong)bVar34);
  *puVar22 = pvVar36;
  bVar34 = btree->vsize;
  ppbVar32[-1] = (bnode *)0x10c8cc;
  pvVar23 = malloc((ulong)bVar34);
  puVar22[1] = pvVar23;
  pbVar2 = btree->kv_ops->init_kv_var;
  if (pbVar2 != (btree_print_func *)0x0) {
    ppbVar32[-1] = (bnode *)0x10c8ec;
    (*pbVar2)(btree,pvVar36,pvVar23);
  }
  pvVar9 = local_68;
  if (local_68 != (void *)0x0) {
    pbVar2 = btree->kv_ops->set_key;
    ppbVar32[-1] = (bnode *)0x10c902;
    (*pbVar2)(btree,pvVar36,pvVar9);
  }
  plVar39 = local_60;
  if (local_60 != (list *)0x0) {
    pbVar2 = btree->kv_ops->set_value;
    ppbVar32[-1] = (bnode *)0x10c918;
    (*pbVar2)(btree,pvVar23,plVar39);
  }
  plVar39 = local_58;
  ppbVar32[-1] = (bnode *)0x10c928;
  list_push_back(plVar39,(list_elem *)(puVar22 + 2));
  *local_90 = 1;
  pvVar36 = local_68;
  uVar1 = btree->height;
  local_40[(ulong)uVar1 - 1] = btree->root_bid;
  if (uVar1 != 0) {
    lVar37 = (ulong)uVar1 + 1;
    do {
      pvVar23 = btree->blk_handle;
      bVar26 = local_40[lVar37 + -2];
      p_Var3 = btree->blk_ops->blk_read;
      ppbVar32[-1] = (bnode *)0x10c968;
      pbVar24 = (bnode *)(*p_Var3)(pvVar23,bVar26);
      pbVar25 = pbVar24 + 1;
      if ((pbVar24->flag & 2) != 0) {
        pbVar25 = (bnode *)((long)&pbVar25->kvsize +
                           (ulong)((ushort)(pbVar25->kvsize << 8 | pbVar25->kvsize >> 8) + 0x11 &
                                  0xfffffff0));
      }
      (pbVar24->field_4).data = pbVar25;
      local_50[lVar37 + -2] = pbVar24;
      ppbVar32[-1] = (bnode *)0x10c9a4;
      iVar20 = _btree_find_entry(btree,pbVar24,pvVar36);
      pvVar9 = local_48;
      pvVar23 = local_80;
      local_78[lVar37 + -2] = iVar20;
      if (lVar37 != 2) {
        if (iVar20 == 0xffff) {
          local_78[lVar37 + -2] = 0;
        }
        iVar20 = local_78[lVar37 + -2];
        p_Var4 = btree->kv_ops->get_kv;
        ppbVar32[-1] = (bnode *)0x10c9e4;
        (*p_Var4)(pbVar24,iVar20,pvVar9,pvVar23);
        p_Var5 = btree->kv_ops->value2bid;
        ppbVar32[-1] = (bnode *)0x10c9ee;
        bVar26 = (*p_Var5)(pvVar23);
        local_40[lVar37 + -3] =
             bVar26 >> 0x38 | (bVar26 & 0xff000000000000) >> 0x28 |
             (bVar26 & 0xff0000000000) >> 0x18 | (bVar26 & 0xff00000000) >> 8 |
             (bVar26 & 0xff000000) << 8 | (bVar26 & 0xff0000) << 0x18 | (bVar26 & 0xff00) << 0x28 |
             bVar26 << 0x38;
      }
      lVar37 = lVar37 + -1;
    } while (1 < lVar37);
  }
  bVar40 = btree->height == 0;
  bVar34 = !bVar40;
  if (bVar40) {
    local_60 = (list *)((ulong)local_60 & 0xffffffff00000000);
  }
  else {
    bVar26 = 0;
    local_98 = 0;
    pvVar36 = local_70;
    local_31 = (bool)bVar34;
    do {
      pvVar23 = local_48;
      uVar1 = local_78[bVar26];
      uVar35 = (uint)uVar1;
      if (uVar1 != 0xffff) {
        pbVar24 = local_50[bVar26];
        p_Var4 = btree->kv_ops->get_kv;
        ppbVar32[-1] = (bnode *)0x10ca57;
        (*p_Var4)(pbVar24,uVar1,pvVar23,(void *)0x0);
      }
      pvVar9 = local_48;
      pvVar23 = local_68;
      local_88 = uVar35;
      if (bVar26 != 0) {
        if (uVar1 == 0) {
          pvVar6 = btree->aux;
          pcVar7 = (code *)btree->kv_ops->cmp;
          ppbVar32[-1] = (bnode *)0x10ca79;
          iVar21 = (*pcVar7)(pvVar23,pvVar9,pvVar6);
          if (iVar21 < 0) {
            *(undefined1 *)(nodesize + bVar26) = 1;
          }
        }
        if (*(char *)((bVar26 - 1) + (long)local_a0) != '\0') {
          uVar29 = local_40[bVar26 - 1];
          lStack_d8.tail =
               (list_elem *)
               (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 | (uVar29 & 0xff00) << 0x28
               | uVar29 << 0x38);
          p_Var4 = btree->kv_ops->set_kv;
          pbVar24 = local_50[bVar26];
          p_Var8 = btree->kv_ops->bid2value;
          ppbVar32[-1] = (bnode *)0x10cac5;
          pvVar27 = (*p_Var8)((bid_t *)&lStack_d8.tail);
          pvVar36 = local_48;
          uVar35 = local_88;
          ppbVar32[-1] = (bnode *)0x10cad5;
          (*p_Var4)(pbVar24,(idx_t)uVar35,pvVar36,pvVar27);
          *(undefined1 *)((long)local_70 + bVar26) = 1;
          pvVar36 = local_70;
        }
      }
      pbVar38 = local_40;
      pvVar23 = local_48;
      if ((local_90[bVar26] == '\0') && (*(char *)(nodesize + bVar26) == '\0')) {
        bVar40 = true;
      }
      else {
        local_32 = *(char *)(nodesize + bVar26);
        local_98 = 0;
        pvVar36 = local_68;
        if (local_32 == '\0') {
          pvVar36 = (void *)0x0;
        }
        if ((bVar26 == 0) && (uVar1 != 0xffff)) {
          plVar33 = local_58->head[-1].prev;
          pvVar9 = btree->aux;
          pcVar7 = (code *)btree->kv_ops->cmp;
          ppbVar32[-1] = (bnode *)0x10cb4f;
          iVar21 = (*pcVar7)(plVar33,pvVar23,pvVar9);
          local_98 = (ulong)(iVar21 == 0);
        }
        local_60 = local_58 + bVar26;
        local_b8 = bVar26 + 1;
        local_84 = 0;
        new_bid = bVar26;
        do {
          plVar39 = local_60;
          bVar10 = pbVar38[bVar26];
          pbVar24 = local_50[bVar26];
          ppbVar32[-1] = (bnode *)0x10cbb0;
          iVar21 = _bnode_size_check(btree,bVar10,pbVar24,pvVar36,plVar39,&local_b0);
          pbVar38 = local_40;
          sVar19 = local_b0;
          if (iVar21 == 0 && (int)local_98 == 0) {
            p_Var12 = btree->blk_ops->blk_enlarge_node;
            if ((p_Var12 != (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)0x0) &&
               (bVar10 = local_40[bVar26], (char)(bVar10 >> 0x30) != '\0')) {
              pvVar23 = btree->blk_handle;
              ppbVar32[-1] = (bnode *)0x10cc85;
              pbVar24 = (bnode *)(*p_Var12)(pvVar23,bVar10,sVar19,&_bid);
              if (pbVar24 == (bnode *)0x0) {
                iVar21 = 0;
              }
              else {
                *(undefined1 *)((long)local_a0 + bVar26) = 1;
                pbVar38[bVar26] = _bid;
                pbVar25 = pbVar24 + 1;
                if ((pbVar24->flag & 2) != 0) {
                  pbVar25 = (bnode *)((long)&pbVar25->kvsize +
                                     (ulong)((ushort)(pbVar25->kvsize << 8 | pbVar25->kvsize >> 8) +
                                             0x11 & 0xfffffff0));
                }
                (pbVar24->field_4).data = pbVar25;
                local_50[bVar26] = pbVar24;
                iVar21 = 0xe;
                if (local_b8 == btree->height) {
                  btree->root_bid = pbVar38[bVar26];
                }
              }
              if (pbVar24 != (bnode *)0x0) goto LAB_0010cda6;
            }
            sVar19 = local_b0;
            pbVar24 = local_50[bVar26];
            pvVar23 = btree->blk_handle;
            p_Var13 = btree->blk_ops->blk_get_size;
            ppbVar32[-1] = (bnode *)0x10cd14;
            sVar28 = (*p_Var13)(pvVar23,0xffffffffffffffff);
            pbVar38 = local_40;
            node_00 = local_50;
            pvVar23 = local_68;
            idx = local_78;
            lVar37 = -0x11;
            if ((pbVar24->flag & 2) != 0) {
              uVar1 = pbVar24[1].kvsize;
              lVar37 = -0x11 - (ulong)((ushort)(uVar1 << 8 | uVar1 >> 8) + 0x11 & 0xfffffff0);
            }
            iVar21 = 0;
            uVar29 = (sVar19 + lVar37 + sVar28 + lVar37) / (sVar28 + lVar37);
            if (uVar29 == 1) {
              uVar29 = 2;
            }
            ppbVar32[-2] = (bnode *)local_90;
            ppbVar32[-3] = (bnode *)nodesize;
            ppbVar32[-4] = (bnode *)local_70;
            ppbVar32[-5] = (bnode *)local_80;
            ppbVar32[-6] = (bnode *)local_48;
            ppbVar32[-7] = (bnode *)uVar29;
            ppbVar32[-8] = (bnode *)local_58;
            ppbVar32[-9] = (bnode *)0x10cd9f;
            local_84 = _btree_split_node(btree,pvVar23,node_00,pbVar38,idx,(int)bVar26,
                                         (list *)ppbVar32[-8],(size_t)ppbVar32[-7],ppbVar32[-6],
                                         ppbVar32[-5],(int8_t *)ppbVar32[-4],(int8_t *)ppbVar32[-3],
                                         (int8_t *)ppbVar32[-2]);
          }
          else {
            if (local_90[bVar26] != '\0') {
              for (plVar33 = local_60->head; plVar33 != (list_elem *)0x0; plVar33 = plVar33->next) {
                plVar30 = plVar33[-1].prev;
                plVar11 = plVar33[-1].next;
                ppbVar32[-1] = (bnode *)0x10cbeb;
                _btree_add_entry(btree,pbVar24,plVar30,plVar11);
              }
            }
            pvVar9 = local_48;
            pvVar23 = local_80;
            uVar35 = local_88;
            if (local_32 != '\0') {
              p_Var4 = btree->kv_ops->get_kv;
              ppbVar32[-1] = (bnode *)0x10cc16;
              (*p_Var4)(pbVar24,(idx_t)uVar35,pvVar9,pvVar23);
              pvVar9 = local_68;
              bVar26 = new_bid;
              p_Var4 = btree->kv_ops->set_kv;
              ppbVar32[-1] = (bnode *)0x10cc34;
              (*p_Var4)(pbVar24,(idx_t)uVar35,pvVar9,pvVar23);
            }
            *(undefined1 *)((long)local_70 + bVar26) = 1;
            iVar21 = 0;
            pbVar38 = local_40;
          }
LAB_0010cda6:
        } while (iVar21 == 0xe);
        bVar40 = (char)local_84 == '\0';
        pvVar36 = local_70;
      }
      if (!bVar40) break;
      if (*(char *)((long)pvVar36 + bVar26) != '\0') {
        pvVar23 = btree->blk_handle;
        bVar10 = pbVar38[bVar26];
        p_Var14 = btree->blk_ops->blk_is_writable;
        ppbVar32[-1] = (bnode *)0x10cdd5;
        iVar21 = (*p_Var14)(pvVar23,bVar10);
        pvVar23 = btree->blk_handle;
        if (iVar21 == 0) {
          pbVar38 = pbVar38 + bVar26;
          bVar10 = *pbVar38;
          p_Var16 = btree->blk_ops->blk_move;
          ppbVar32[-1] = (bnode *)0x10cdf7;
          (*p_Var16)(pvVar23,bVar10,pbVar38);
          *(undefined1 *)((long)local_a0 + bVar26) = 1;
          if (bVar26 + 1 == (ulong)btree->height) {
            btree->root_bid = *pbVar38;
          }
        }
        else {
          bVar10 = pbVar38[bVar26];
          p_Var15 = btree->blk_ops->blk_set_dirty;
          ppbVar32[-1] = (bnode *)0x10cde8;
          (*p_Var15)(pvVar23,bVar10);
        }
      }
      bVar26 = bVar26 + 1;
      local_31 = bVar26 < btree->height;
    } while (local_31);
    local_60 = (list *)CONCAT44(local_60._4_4_,(uint)((int)local_98 != 0));
    bVar34 = local_31;
  }
  p_Var17 = btree->blk_ops->blk_operation_end;
  if (p_Var17 != (_func_void_void_ptr *)0x0) {
    pvVar36 = btree->blk_handle;
    ppbVar32[-1] = (bnode *)0x10ce64;
    (*p_Var17)(pvVar36);
  }
  pvVar23 = local_48;
  pvVar36 = local_80;
  pbVar2 = btree->kv_ops->free_kv_var;
  if (pbVar2 != (btree_print_func *)0x0) {
    ppbVar32[-1] = (bnode *)0x10ce7e;
    (*pbVar2)(btree,pvVar23,pvVar36);
  }
  local_40 = (bid_t *)-(ulong)(bVar34 & 1);
  for (local_50 = (bnode **)0x0; (long)local_50 < (long)((ulong)btree->height + (long)local_40);
      local_50 = (bnode **)((long)local_50 + 1)) {
    if (local_58[(long)local_50].head != (list_elem *)0x0) {
      plVar39 = local_58 + (long)local_50;
      plVar33 = local_58[(long)local_50].head;
      do {
        ppbVar32[-1] = (bnode *)0x10cec0;
        plVar30 = list_remove(plVar39,plVar33);
        pbVar2 = btree->kv_ops->free_kv_var;
        if (pbVar2 != (btree_print_func *)0x0) {
          plVar11 = plVar33[-1].prev;
          plVar18 = plVar33[-1].next;
          ppbVar32[-1] = (bnode *)0x10cedf;
          (*pbVar2)(btree,plVar11,plVar18);
        }
        plVar11 = plVar33[-1].prev;
        ppbVar32[-1] = (bnode *)0x10ceee;
        free(plVar11);
        plVar11 = plVar33[-1].next;
        ppbVar32[-1] = (bnode *)0x10cef8;
        free(plVar11);
        ppbVar32[-1] = (bnode *)0x10cf00;
        free(plVar33 + -1);
        plVar33 = plVar30;
      } while (plVar30 != (list_elem *)0x0);
    }
  }
  return (btree_result)local_60;
}

Assistant:

btree_result btree_insert(struct btree *btree, void *key, void *value)
{
    void *addr;
    size_t nsplitnode = 1;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    // index# and block ID for each level
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid = alca(bid_t, btree->height);
    bid_t _bid;
    // flags
    int8_t *modified = alca(int8_t, btree->height);
    int8_t *moved = alca(int8_t, btree->height);
    int8_t *ins = alca(int8_t, btree->height);
    int8_t *minkey_replace = alca(int8_t, btree->height);
    int8_t height_growup;

    // key, value to be inserted
    struct list *kv_ins_list = alca(struct list, btree->height);
    struct kv_ins_item *kv_item;
    struct list_elem *e;

    // index# where kv is inserted
    idx_t *idx_ins = alca(idx_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i, j, _is_update = 0;

    // initialize flags
    for (i=0;i<btree->height;++i) {
        moved[i] = modified[i] = ins[i] = minkey_replace[i] = 0;
    }
    height_growup = 0;

    // initialize temporary variables
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, k, v);
        for (i=0;i<btree->height;++i){
            list_init(&kv_ins_list[i]);
        }
    }

    // copy key-value pair to be inserted into leaf node
    kv_item = _kv_ins_item_create(btree, key, value);
    list_push_back(&kv_ins_list[0], &kv_item->le);

    ins[0] = 1;

    // set root node
    bid[btree->height-1] = btree->root_bid;

    // find path from root to leaf
    for (i=btree->height-1; i>=0; --i){
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (i > 0) {
            // index (non-leaf) node
            if (idx[i] == BTREE_IDX_NOT_FOUND)
                // KEY is smaller than the smallest key in this node ..
                // just follow the smallest key
                idx[i] = 0;

            // get bid of child node from value
            btree->kv_ops->get_kv(node[i], idx[i], k, v);
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node .. do nothing
        }
    }

    // cascaded insert from leaf to root
    for (i=0;i<btree->height;++i){

        if (idx[i] != BTREE_IDX_NOT_FOUND)
            btree->kv_ops->get_kv(node[i], idx[i], k, NULL);

        if (i > 0) {
            // in case of index node
            // when KEY is smaller than smallest key in index node
            if (idx[i] == 0 && btree->kv_ops->cmp(key, k, btree->aux) < 0) {
                // change node's smallest key
                minkey_replace[i] = 1;
            }

            // when child node is moved to new block
            if (moved[i-1]) {
                // replace the bid (value)
                _bid = _endian_encode(bid[i-1]);
                btree->kv_ops->set_kv(node[i], idx[i], k,
                                      btree->kv_ops->bid2value(&_bid));
                modified[i] = 1;
            }
        }

        if (ins[i] || minkey_replace[i]) {
            // there is a key-value pair to be inserted into this (level of)
            // node check whether btree node space is enough to add new
            // key-value pair or not, OR action is not insertion but update
            // (key_ins exists in current node)
            _is_update = 0;
            size_t nodesize;
            void *new_minkey = (minkey_replace[i])?(key):(NULL);

            if (i==0) {
                e = list_begin(&kv_ins_list[i]);
                kv_item = _get_entry(e, struct kv_ins_item, le);
                _is_update =
                    (idx[i] != BTREE_IDX_NOT_FOUND &&
                     !btree->kv_ops->cmp(kv_item->key, k, btree->aux));
            }

        check_node:;
            int _size_check =
                _bnode_size_check(btree, bid[i], node[i], new_minkey,
                                  &kv_ins_list[i], &nodesize);

            if (_size_check || _is_update ) {
                //2 enough space
                if (ins[i]) {
                    // insert key/value pair(s)
                    // insert all kv pairs on list
                    e = list_begin(&kv_ins_list[i]);
                    while(e) {
                        kv_item = _get_entry(e, struct kv_ins_item, le);
                        idx_ins[i] = _btree_add_entry(btree, node[i],
                                                 kv_item->key, kv_item->value);
                        e = list_next(e);
                    }
                }
                if (minkey_replace[i]) {
                    // replace the minimum key in the node to KEY
                    btree->kv_ops->get_kv(node[i], idx[i], k, v);
                    btree->kv_ops->set_kv(node[i], idx[i], key, v);
                }
                modified[i] = 1;

            }else{
                //2 not enough
                // first check if the node can be enlarged
                if (btree->blk_ops->blk_enlarge_node &&
                    is_subblock(bid[i])) {
                    bid_t new_bid;
                    addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                        bid[i], nodesize, &new_bid);
                    if (addr) {
                        // the node can be enlarged .. fetch the enlarged node
                        moved[i] = 1;
                        bid[i] = new_bid;
                        node[i] = _fetch_bnode(btree, addr, i+1);
                        if (i+1 == btree->height) {
                            // if moved node is root node
                            btree->root_bid = bid[i];
                        }
                        // start over
                        goto check_node;
                    }
                }

                //otherwise, split the node
                nsplitnode = _btree_get_nsplitnode(btree, BLK_NOT_FOUND,
                                                   node[i], nodesize);
                // force the node split when the node size of new layout is
                // larger than the current node size
                if (nsplitnode == 1) nsplitnode = 2;

                height_growup = _btree_split_node(
                    btree, key, node, bid, idx, i,
                    kv_ins_list, nsplitnode, k, v,
                    modified, minkey_replace, ins);
            } // split
        } // insert

        if (height_growup) break;

        if (modified[i]) {
            //2 when the node is modified
            if (!btree->blk_ops->blk_is_writable(btree->blk_handle, bid[i])) {
                // not writable .. already flushed block -> cannot overwrite,
                // we have to move to new block
                height_growup = _btree_move_modified_node(
                    btree, key, node, bid, idx, i,
                    kv_ins_list, k, v,
                    modified, minkey_replace, ins, moved);

                if (height_growup) break;
            }else{
                // writable .. just set dirty to write back into storage
                btree->blk_ops->blk_set_dirty(btree->blk_handle, bid[i]);
            } // is writable
        } // is modified
    } // for loop

    // release temporary resources
    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);

    for (j=0; j < ((height_growup)?(btree->height-1):(btree->height)); ++j){
        e = list_begin(&kv_ins_list[j]);
        while(e) {
            kv_item = _get_entry(e, struct kv_ins_item, le);
            e = list_remove(&kv_ins_list[j], e);

            if (btree->kv_ops->free_kv_var) {
                btree->kv_ops->free_kv_var(btree, kv_item->key, kv_item->value);
            }
            _kv_ins_item_free(kv_item);
        }
    }

    if (_is_update) {
        return BTREE_RESULT_UPDATE;
    }else{
        return BTREE_RESULT_SUCCESS;
    }
}